

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_dr_prediction_z1_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  int i;
  int base_inc;
  int frac_bits;
  int max_base_x;
  int val;
  int shift;
  int base;
  int x;
  int c;
  int r;
  int local_50;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_8;
  
  bVar3 = (byte)i;
  iVar1 = in_EDX + in_ECX + -1 << (bVar3 & 0x1f);
  local_34 = frac_bits;
  local_2c = 0;
  local_8 = in_RDI;
  while( true ) {
    if (in_ECX <= local_2c) {
      return;
    }
    local_38 = local_34 >> (6 - bVar3 & 0x1f);
    iVar2 = (int)(local_34 << (bVar3 & 0x1f) & 0x3fU) >> 1;
    if (iVar1 <= local_38) break;
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      if (local_38 < iVar1) {
        *(char *)((long)local_8 + (long)local_30) =
             (char)((int)((uint)*(byte *)(in_R8 + local_38) * (0x20 - iVar2) +
                          (uint)*(byte *)(in_R8 + (local_38 + 1)) * iVar2 + 0x10) >> 5);
      }
      else {
        *(undefined1 *)((long)local_8 + (long)local_30) = *(undefined1 *)(in_R8 + iVar1);
      }
      local_38 = (1 << (bVar3 & 0x1f)) + local_38;
    }
    local_2c = local_2c + 1;
    local_8 = (void *)(in_RSI + (long)local_8);
    local_34 = frac_bits + local_34;
  }
  for (local_50 = local_2c; local_50 < in_ECX; local_50 = local_50 + 1) {
    memset(local_8,(uint)*(byte *)(in_R8 + iVar1),(long)in_EDX);
    local_8 = (void *)(in_RSI + (long)local_8);
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_above, int dx, int dy) {
  int r, c, x, base, shift, val;

  (void)left;
  (void)dy;
  assert(dy == 1);
  assert(dx > 0);

  const int max_base_x = ((bw + bh) - 1) << upsample_above;
  const int frac_bits = 6 - upsample_above;
  const int base_inc = 1 << upsample_above;
  x = dx;
  for (r = 0; r < bh; ++r, dst += stride, x += dx) {
    base = x >> frac_bits;
    shift = ((x << upsample_above) & 0x3F) >> 1;

    if (base >= max_base_x) {
      for (int i = r; i < bh; ++i) {
        memset(dst, above[max_base_x], bw * sizeof(dst[0]));
        dst += stride;
      }
      return;
    }

    for (c = 0; c < bw; ++c, base += base_inc) {
      if (base < max_base_x) {
        val = above[base] * (32 - shift) + above[base + 1] * shift;
        dst[c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        dst[c] = above[max_base_x];
      }
    }
  }
}